

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O2

bool test_queue(void)

{
  uint uVar1;
  int iVar2;
  ostream *poVar3;
  int in_ECX;
  nfds_t __nfds;
  nfds_t __nfds_00;
  nfds_t __nfds_01;
  nfds_t __nfds_02;
  pollfd *ppVar4;
  ArrayQueue queue;
  
  si9ma::ArrayQueue::ArrayQueue(&queue,3);
  si9ma::ArrayQueue::push(&queue,100);
  ppVar4 = (pollfd *)0x1e;
  si9ma::ArrayQueue::push(&queue,0x1e);
  uVar1 = si9ma::ArrayQueue::poll(&queue,ppVar4,__nfds,in_ECX);
  ppVar4 = (pollfd *)(ulong)uVar1;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar2 = si9ma::ArrayQueue::poll(&queue,ppVar4,__nfds_00,in_ECX);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  si9ma::ArrayQueue::push(&queue,0x32);
  si9ma::ArrayQueue::push(&queue,0x50);
  si9ma::ArrayQueue::push(&queue,0x50);
  si9ma::ArrayQueue::push(&queue,0x50);
  ppVar4 = (pollfd *)0x50;
  si9ma::ArrayQueue::push(&queue,0x50);
  uVar1 = si9ma::ArrayQueue::poll(&queue,ppVar4,__nfds_01,in_ECX);
  ppVar4 = (pollfd *)(ulong)uVar1;
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,uVar1);
  std::endl<char,std::char_traits<char>>(poVar3);
  iVar2 = si9ma::ArrayQueue::poll(&queue,ppVar4,__nfds_02,in_ECX);
  poVar3 = (ostream *)std::ostream::operator<<((ostream *)&std::cout,iVar2);
  std::endl<char,std::char_traits<char>>(poVar3);
  si9ma::ArrayQueue::~ArrayQueue(&queue);
  return true;
}

Assistant:

bool test_queue(){
    ArrayQueue queue(3);
    try {
        queue.push(100);
        queue.push(30);
        cout << queue.poll() << endl;
        cout << queue.poll() << endl;
        queue.push(50);
        queue.push(80);
        queue.push(80);
        queue.push(80);
        queue.push(80);
        cout << queue.poll() << endl;
        cout << queue.poll() << endl;
        return true;
    }catch (char const* str){
        cout << str << endl;
        return false;
    }
}